

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

XMLComment * __thiscall tinyxml2::XMLDocument::NewComment(XMLDocument *this,char *str)

{
  XMLComment *pXVar1;
  
  pXVar1 = (XMLComment *)MemPoolT<88>::Alloc(&this->_commentPool);
  (pXVar1->super_XMLNode)._document = this;
  (pXVar1->super_XMLNode)._parent = (XMLNode *)0x0;
  (pXVar1->super_XMLNode)._value._flags = 0;
  (pXVar1->super_XMLNode)._value._start = (char *)0x0;
  (pXVar1->super_XMLNode)._value._end = (char *)0x0;
  (pXVar1->super_XMLNode)._firstChild = (XMLNode *)0x0;
  (pXVar1->super_XMLNode)._lastChild = (XMLNode *)0x0;
  (pXVar1->super_XMLNode)._prev = (XMLNode *)0x0;
  (pXVar1->super_XMLNode)._next = (XMLNode *)0x0;
  (pXVar1->super_XMLNode)._vptr_XMLNode = (_func_int **)&PTR_ToElement_00275600;
  (pXVar1->super_XMLNode)._memPool = &(this->_commentPool).super_MemPool;
  StrPair::SetStr(&(pXVar1->super_XMLNode)._value,str,0);
  return pXVar1;
}

Assistant:

XMLComment* XMLDocument::NewComment( const char* str )
{
    TIXMLASSERT( sizeof( XMLComment ) == _commentPool.ItemSize() );
    XMLComment* comment = new (_commentPool.Alloc()) XMLComment( this );
    comment->_memPool = &_commentPool;
    comment->SetValue( str );
    return comment;
}